

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O0

double __thiscall
soplex::SVectorBase<double>::operator*(SVectorBase<double> *this,VectorBase<double> *w)

{
  double *pdVar1;
  SVectorBase<double> *in_RDI;
  double dVar2;
  int i;
  Nonzero<double> *e;
  StableSum<double> x;
  int in_stack_ffffffffffffffbc;
  VectorBase<double> *this_00;
  int local_2c;
  Nonzero<double> *local_28;
  StableSum<double> local_20 [2];
  
  StableSum<double>::StableSum(local_20);
  local_28 = in_RDI->m_elem;
  local_2c = size(in_RDI);
  while (local_2c = local_2c + -1, -1 < local_2c) {
    this_00 = (VectorBase<double> *)local_28->val;
    pdVar1 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffffbc);
    StableSum<double>::operator+=(local_20,(double)this_00 * *pdVar1);
    local_28 = local_28 + 1;
  }
  dVar2 = StableSum::operator_cast_to_double((StableSum *)local_20);
  return dVar2;
}

Assistant:

inline
R SVectorBase<R>::operator*(const VectorBase<R>& w) const
{
   StableSum<R> x;
   Nonzero<R>* e = m_elem;

   for(int i = size() - 1; i >= 0; --i)
   {
      x += e->val * w[e->idx];
      e++;
   }

   return x;
}